

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O1

uint32_t __thiscall
spvtools::opt::StructPackingPass::getPackedSize(StructPackingPass *this,Type *type)

{
  undefined8 *puVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  Type *pTVar7;
  undefined4 extraout_var_02;
  uint32_t unaff_EBX;
  undefined8 *puVar8;
  Array *arrayType;
  undefined4 extraout_var_01;
  
  if (type->kind_ == kStruct) {
    iVar2 = (*type->_vptr_Type[0x1e])(type);
    puVar8 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar2) + 0x28);
    puVar1 = *(undefined8 **)(CONCAT44(extraout_var_00,iVar2) + 0x30);
    unaff_EBX = 0;
    if (puVar8 != puVar1) {
      uVar3 = 1;
      unaff_EBX = 0;
      do {
        pTVar7 = (Type *)*puVar8;
        uVar5 = getPackedAlignment(this,pTVar7);
        uVar4 = uVar3;
        if (uVar3 < uVar5) {
          uVar4 = uVar5;
        }
        uVar3 = uVar5;
        if (pTVar7->kind_ != kStruct) {
          uVar3 = 1;
        }
        uVar5 = getPackedSize(this,pTVar7);
        unaff_EBX = uVar5 + (-uVar4 & (unaff_EBX + uVar4) - 1);
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar1);
    }
  }
  else if (type->kind_ == kArray) {
    iVar2 = (*type->_vptr_Type[0x18])(type);
    arrayType = (Array *)CONCAT44(extraout_var,iVar2);
    if (arrayType != (Array *)0x0) {
      uVar3 = getPackedArrayStride(this,arrayType);
      uVar4 = getConstantInt(this,(arrayType->length_info_).id);
      unaff_EBX = uVar4 * uVar3;
      if ((this->packingRules_ - HlslCbuffer < 2) &&
         (pTVar7 = arrayType->element_type_, pTVar7->kind_ != kStruct)) {
        uVar3 = getScalarElementCount(pTVar7);
        uVar4 = getPackedBaseSize(pTVar7);
        unaff_EBX = uVar4 * (uVar3 - 4) + unaff_EBX;
      }
    }
    if (arrayType == (Array *)0x0) {
      __assert_fail("0 && \"Unrecognized type to get packed size\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                    ,300,
                    "uint32_t spvtools::opt::StructPackingPass::getPackedSize(const analysis::Type &) const"
                   );
    }
  }
  else {
    uVar3 = getPackedBaseSize(type);
    if (this->packingRules_ - Scalar < 2) {
      uVar4 = getScalarElementCount(type);
    }
    else {
      iVar2 = (*type->_vptr_Type[0x10])(type);
      lVar6 = CONCAT44(extraout_var_01,iVar2);
      if (lVar6 != 0) {
        pTVar7 = (Type *)(**(code **)(**(long **)(lVar6 + 0x28) + 0x70))();
        if (pTVar7 == (Type *)0x0) {
          __assert_fail("matrixSubType != nullptr && \"Matrix sub-type is expected to be a vector type\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/struct_packing_pass.cpp"
                        ,0x115,
                        "uint32_t spvtools::opt::StructPackingPass::getPackedSize(const analysis::Type &) const"
                       );
        }
        if (((this->packingRules_ - Std140 & 0xfffffffa) == 0) || (*(int *)(lVar6 + 0x30) == 3)) {
          uVar3 = *(int *)&pTVar7[1].decorations_.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start * uVar3 * 4;
        }
        else {
          uVar3 = *(int *)(lVar6 + 0x30) * uVar3 *
                  *(int *)&pTVar7[1].decorations_.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
        }
        if (1 < this->packingRules_ - HlslCbuffer) {
          return uVar3;
        }
        iVar2 = *(int *)&pTVar7[1].decorations_.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        uVar4 = getPackedBaseSize(pTVar7);
        return uVar4 * (iVar2 + -4) + uVar3;
      }
      iVar2 = (*type->_vptr_Type[0xe])(type);
      if (CONCAT44(extraout_var_02,iVar2) == 0) {
        return uVar3;
      }
      uVar4 = *(uint32_t *)(CONCAT44(extraout_var_02,iVar2) + 0x30);
    }
    unaff_EBX = uVar4 * uVar3;
  }
  return unaff_EBX;
}

Assistant:

uint32_t StructPackingPass::getPackedSize(const analysis::Type& type) const {
  switch (type.kind()) {
    case analysis::Type::kArray: {
      if (const analysis::Array* arrayType = type.AsArray()) {
        uint32_t size =
            getPackedArrayStride(*arrayType) * getArrayLength(*arrayType);

        // For arrays of vector and matrices in HLSL, the last element has a
        // size depending on its vector/matrix size to allow packing other
        // vectors in the last element.
        const analysis::Type* arraySubType = arrayType->element_type();
        if (isPackingHlsl(packingRules_) &&
            arraySubType->kind() != analysis::Type::kStruct) {
          size -= (4 - getScalarElementCount(*arraySubType)) *
                  getPackedBaseSize(*arraySubType);
        }
        return size;
      }
      break;
    }
    case analysis::Type::kStruct: {
      uint32_t size = 0;
      uint32_t padAlignment = 1;
      for (const analysis::Type* memberType :
           type.AsStruct()->element_types()) {
        const uint32_t packedAlignment = getPackedAlignment(*memberType);
        const uint32_t alignment =
            std::max<uint32_t>(packedAlignment, padAlignment);
        padAlignment = getPadAlignment(*memberType, packedAlignment);
        size = alignPow2(size, alignment);
        size += getPackedSize(*memberType);
      }
      return size;
    }
    default: {
      const uint32_t baseAlignment = getPackedBaseSize(type);
      if (isPackingScalar(packingRules_)) {
        return getScalarElementCount(type) * baseAlignment;
      } else {
        uint32_t size = 0;
        if (const analysis::Matrix* matrixType = type.AsMatrix()) {
          const analysis::Vector* matrixSubType =
              matrixType->element_type()->AsVector();
          assert(matrixSubType != nullptr &&
                 "Matrix sub-type is expected to be a vector type");
          if (isPackingVec4Padded(packingRules_) ||
              matrixType->element_count() == 3)
            size = matrixSubType->element_count() * baseAlignment * 4;
          else
            size = matrixSubType->element_count() * baseAlignment *
                   matrixType->element_count();

          // For matrices in HLSL, the last element has a size depending on its
          // vector size to allow packing other vectors in the last element.
          if (isPackingHlsl(packingRules_)) {
            size -= (4 - matrixSubType->element_count()) *
                    getPackedBaseSize(*matrixSubType);
          }
        } else if (const analysis::Vector* vectorType = type.AsVector()) {
          size = vectorType->element_count() * baseAlignment;
        } else {
          size = baseAlignment;
        }
        return size;
      }
    }
  }
  assert(0 && "Unrecognized type to get packed size");
  return 0;
}